

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::
ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,Generator *this,EnumDescriptor *descriptor)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string name;
  string prefix;
  allocator local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_80,"_",&local_e1);
  std::__cxx11::string::string((string *)&local_e0,*(string **)(descriptor + 8));
  if (*(Descriptor **)(descriptor + 0x18) == (Descriptor *)0x0) {
    bVar1 = std::operator==(&local_80,".");
    if (bVar1) {
      anon_unknown_0::ResolveKeyword(&local_a0,&local_e0);
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,local_e0.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_e0._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,local_e0.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_e0._M_string_length;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    goto LAB_002c6652;
  }
  anon_unknown_0::NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            (&local_a0,*(Descriptor **)(descriptor + 0x18),&local_80);
  bVar1 = std::operator==(&local_80,".");
  if (bVar1) {
    bVar1 = anon_unknown_0::IsPythonKeyword(&local_e0);
    if (!bVar1) goto LAB_002c6593;
    std::operator+(&local_60,"getattr(",&local_a0);
    std::operator+(&local_40,&local_60,", \'");
    std::operator+(&local_c0,&local_40,&local_e0);
    std::operator+(__return_storage_ptr__,&local_c0,"\')");
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = &local_60;
  }
  else {
LAB_002c6593:
    std::operator+(&local_c0,&local_a0,&local_80);
    std::operator+(__return_storage_ptr__,&local_c0,&local_e0);
    this_00 = &local_c0;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_a0);
LAB_002c6652:
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  UpperString(__return_storage_ptr__);
  std::operator+(&local_e0,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    anon_unknown_0::ModuleAlias(&local_c0,*(string **)*(FileDescriptor **)(descriptor + 0x10));
    std::operator+(&local_a0,&local_c0,".");
    std::operator+(&local_e0,&local_a0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::ModuleLevelDescriptorName(
    const DescriptorT& descriptor) const {
  // FIXME(robinson):
  // We currently don't worry about collisions with underscores in the type
  // names, so these would collide in nasty ways if found in the same file:
  //   OuterProto.ProtoA.ProtoB
  //   OuterProto_ProtoA.ProtoB  # Underscore instead of period.
  // As would these:
  //   OuterProto.ProtoA_.ProtoB
  //   OuterProto.ProtoA._ProtoB  # Leading vs. trailing underscore.
  // (Contrived, but certainly possible).
  //
  // The C++ implementation doesn't guard against this either.  Leaving
  // it for now...
  std::string name = NamePrefixedWithNestedTypes(descriptor, "_");
  ToUpper(&name);
  // Module-private for now.  Easy to make public later; almost impossible
  // to make private later.
  name = "_" + name;
  // We now have the name relative to its own module.  Also qualify with
  // the module name iff this descriptor is from a different .proto file.
  if (descriptor.file() != file_) {
    name = ModuleAlias(descriptor.file()->name()) + "." + name;
  }
  return name;
}